

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::GenerateLdHomeObj(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  uint32 uVar3;
  undefined4 *puVar4;
  Opnd *pOVar5;
  IndirOpnd *pIVar6;
  BranchInstr *pBVar7;
  JITTimeFunctionBody *pJVar8;
  RegOpnd *dst;
  IndirOpnd *indirOpnd_1;
  IndirOpnd *indirInlineFuncHomeObjOpnd;
  IndirOpnd *indirInlineFuncHomeObjCompNameOpnd;
  BranchInstr *inlineFuncHomObjCompNameBr;
  RegOpnd *funcObjHasInlineCachesOpnd;
  IndirOpnd *indirOpnd;
  uint32 homeObjectOffset;
  BranchInstr *branchInstr;
  Opnd *vtableAddressOpnd;
  Opnd *functionObjOpnd;
  Opnd *dstOpnd;
  RegOpnd *instanceRegOpnd;
  Opnd *opndUndefAddress;
  LabelInstr *scriptFuncLabel;
  LabelInstr *testLabel;
  LabelInstr *labelDone;
  Func *func;
  Instr *instr_local;
  Lowerer *this_local;
  
  labelDone = (LabelInstr *)instr->m_func;
  func = (Func *)instr;
  instr_local = (Instr *)this;
  testLabel = IR::LabelInstr::New(Label,(Func *)labelDone,false);
  scriptFuncLabel = IR::LabelInstr::New(Label,(Func *)labelDone,false);
  opndUndefAddress = (Opnd *)IR::LabelInstr::New(Label,(Func *)labelDone,false);
  ((LabelInstr *)opndUndefAddress)->m_name = L"ScriptFunctionWithHomeObj";
  instanceRegOpnd = (RegOpnd *)LoadLibraryValueOpnd(this,(Instr *)func,ValueUndefined);
  dstOpnd = &IR::RegOpnd::New(TyUint64,(Func *)labelDone)->super_Opnd;
  functionObjOpnd = IR::Instr::GetDst((Instr *)func);
  bVar2 = IR::Opnd::IsRegOpnd(functionObjOpnd);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x642c,"(dstOpnd->IsRegOpnd())","dstOpnd->IsRegOpnd()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  InsertMove(functionObjOpnd,&instanceRegOpnd->super_Opnd,(Instr *)func,true);
  vtableAddressOpnd = (Opnd *)0x0;
  LowererMD::LoadFunctionObjectOpnd(&this->m_lowererMD,(Instr *)func,&vtableAddressOpnd);
  InsertMove(dstOpnd,vtableAddressOpnd,(Instr *)func,true);
  pOVar5 = LoadVTableValueOpnd(this,(Instr *)func,VtableStackScriptFunction);
  pIVar6 = IR::IndirOpnd::New((RegOpnd *)dstOpnd,0,TyUint64,(Func *)labelDone,false);
  pBVar7 = InsertCompareBranch(this,&pIVar6->super_Opnd,pOVar5,BrEq_A,true,testLabel,(Instr *)func,
                               false);
  InsertObjectPoison(dstOpnd,pBVar7,(Instr *)func,false);
  pJVar8 = Func::GetJITFunctionBody((Func *)labelDone);
  bVar2 = JITTimeFunctionBody::HasHomeObj(pJVar8);
  if (bVar2) {
    pJVar8 = Func::GetJITFunctionBody((Func *)labelDone);
    bVar2 = JITTimeFunctionBody::IsCoroutine(pJVar8);
    if (bVar2) {
      indirOpnd._4_4_ =
           Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>::GetOffsetOfHomeObj();
      pJVar8 = Func::GetJITFunctionBody((Func *)labelDone);
      bVar2 = JITTimeFunctionBody::HasComputedName(pJVar8);
      if (bVar2) {
        indirOpnd._4_4_ =
             Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>::GetOffsetOfHomeObj();
      }
      pIVar6 = IR::IndirOpnd::New((RegOpnd *)dstOpnd,indirOpnd._4_4_,TyUint64,(Func *)labelDone,
                                  false);
      InsertMove(dstOpnd,&pIVar6->super_Opnd,(Instr *)func,true);
      InsertBranch(Br,scriptFuncLabel,(Instr *)func);
    }
    else {
      dst = IR::RegOpnd::New(TyUint8,(Func *)func->m_workItem);
      pOVar5 = dstOpnd;
      uVar3 = Js::ScriptFunction::GetOffsetOfHasInlineCaches();
      pIVar6 = IR::IndirOpnd::New((RegOpnd *)pOVar5,uVar3,TyUint8,(Func *)func->m_workItem,false);
      InsertMove(&dst->super_Opnd,&pIVar6->super_Opnd,(Instr *)func,true);
      pBVar7 = InsertTestBranch(&dst->super_Opnd,&dst->super_Opnd,BrEq_A,
                                (LabelInstr *)opndUndefAddress,(Instr *)func);
      InsertObjectPoison(dstOpnd,pBVar7,(Instr *)func,false);
      pJVar8 = Func::GetJITFunctionBody((Func *)labelDone);
      bVar2 = JITTimeFunctionBody::HasComputedName(pJVar8);
      pOVar5 = dstOpnd;
      if (bVar2) {
        uVar3 = Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>::GetOffsetOfHomeObj();
        pIVar6 = IR::IndirOpnd::New((RegOpnd *)pOVar5,uVar3,TyUint64,(Func *)labelDone,false);
        InsertMove(dstOpnd,&pIVar6->super_Opnd,(Instr *)func,true);
        InsertBranch(Br,scriptFuncLabel,(Instr *)func);
      }
      else {
        uVar3 = Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>::GetOffsetOfHomeObj();
        pIVar6 = IR::IndirOpnd::New((RegOpnd *)pOVar5,uVar3,TyUint64,(Func *)labelDone,false);
        InsertMove(dstOpnd,&pIVar6->super_Opnd,(Instr *)func,true);
        InsertBranch(Br,scriptFuncLabel,(Instr *)func);
      }
    }
    IR::Instr::InsertBefore((Instr *)func,(Instr *)opndUndefAddress);
    pOVar5 = dstOpnd;
    uVar3 = Js::FunctionWithHomeObj<Js::ScriptFunction>::GetOffsetOfHomeObj();
    pIVar6 = IR::IndirOpnd::New((RegOpnd *)pOVar5,uVar3,TyUint64,(Func *)labelDone,false);
    InsertMove(dstOpnd,&pIVar6->super_Opnd,(Instr *)func,true);
  }
  else {
    InsertBranch(Br,testLabel,(Instr *)func);
  }
  IR::Instr::InsertBefore((Instr *)func,&scriptFuncLabel->super_Instr);
  InsertTestBranch(dstOpnd,dstOpnd,BrEq_A,testLabel,(Instr *)func);
  InsertMove(functionObjOpnd,dstOpnd,(Instr *)func,true);
  IR::Instr::InsertBefore((Instr *)func,&testLabel->super_Instr);
  IR::Instr::Remove((Instr *)func);
  return;
}

Assistant:

void
Lowerer::GenerateLdHomeObj(IR::Instr* instr)
{
    //  MOV dst, undefined
    //  MOV instance, functionObject  // functionObject through stack params or src1
    //  CMP [instance], VtableStackScriptFunction
    //  JE  $Done
    //  MOV instance, instance->homeObj
    //  TEST instance, instance
    //  JZ  $Done
    //  MOV dst, instance
    //  $Done:

    Func *func = instr->m_func;

    IR::LabelInstr *labelDone = IR::LabelInstr::New(Js::OpCode::Label, func, false);
    IR::LabelInstr *testLabel = IR::LabelInstr::New(Js::OpCode::Label, func, false);
    IR::LabelInstr *scriptFuncLabel = IR::LabelInstr::New(Js::OpCode::Label, func, false);
    LABELNAMESET(scriptFuncLabel, "ScriptFunctionWithHomeObj");
    IR::Opnd *opndUndefAddress = this->LoadLibraryValueOpnd(instr, LibraryValue::ValueUndefined);

    IR::RegOpnd *instanceRegOpnd = IR::RegOpnd::New(TyMachPtr, func);

    IR::Opnd *dstOpnd = instr->GetDst();
    Assert(dstOpnd->IsRegOpnd());
    Lowerer::InsertMove(dstOpnd, opndUndefAddress, instr);

    IR::Opnd * functionObjOpnd = nullptr;
    m_lowererMD.LoadFunctionObjectOpnd(instr, functionObjOpnd);
    Lowerer::InsertMove(instanceRegOpnd, functionObjOpnd, instr);

    IR::Opnd * vtableAddressOpnd = this->LoadVTableValueOpnd(instr, VTableValue::VtableStackScriptFunction);
    IR::BranchInstr* branchInstr = InsertCompareBranch(IR::IndirOpnd::New(instanceRegOpnd, 0, TyMachPtr, func), vtableAddressOpnd,
        Js::OpCode::BrEq_A, true, labelDone, instr);

    InsertObjectPoison(instanceRegOpnd, branchInstr, instr, false);

    if (func->GetJITFunctionBody()->HasHomeObj())
    {
        // Is this a generator function with home obj?
        if (func->GetJITFunctionBody()->IsCoroutine())
        {
            uint32 homeObjectOffset = Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>::GetOffsetOfHomeObj();

            // Is this a generator function with home obj and computed name?
            if (func->GetJITFunctionBody()->HasComputedName())
            {
                homeObjectOffset = Js::FunctionWithComputedName<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>>::GetOffsetOfHomeObj();
            }

            {
                IR::IndirOpnd* indirOpnd = IR::IndirOpnd::New(instanceRegOpnd, homeObjectOffset, TyMachPtr, func);
                Lowerer::InsertMove(instanceRegOpnd, indirOpnd, instr);
            }

            InsertBranch(Js::OpCode::Br, testLabel, instr);
        }
        else
        {
            IR::RegOpnd* funcObjHasInlineCachesOpnd = IR::RegOpnd::New(TyUint8, instr->m_func);
            this->InsertMove(funcObjHasInlineCachesOpnd, IR::IndirOpnd::New(instanceRegOpnd, Js::ScriptFunction::GetOffsetOfHasInlineCaches(), TyUint8, instr->m_func), instr);

            IR::BranchInstr* inlineFuncHomObjCompNameBr = InsertTestBranch(funcObjHasInlineCachesOpnd, funcObjHasInlineCachesOpnd, Js::OpCode::BrEq_A, scriptFuncLabel, instr);
            InsertObjectPoison(instanceRegOpnd, inlineFuncHomObjCompNameBr, instr, false);

            if (func->GetJITFunctionBody()->HasComputedName())
            {
                // Is this a function with inline cache, home obj and computed name?
                {
                    IR::IndirOpnd* indirInlineFuncHomeObjCompNameOpnd = IR::IndirOpnd::New(instanceRegOpnd, Js::FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>>::GetOffsetOfHomeObj(), TyMachPtr, func);
                    Lowerer::InsertMove(instanceRegOpnd, indirInlineFuncHomeObjCompNameOpnd, instr);
                    InsertBranch(Js::OpCode::Br, testLabel, instr);
                }
            }
            else
            {
                // Is this a function with inline cache and home obj?
                {
                    IR::IndirOpnd* indirInlineFuncHomeObjOpnd = IR::IndirOpnd::New(instanceRegOpnd, Js::FunctionWithHomeObj<Js::ScriptFunctionWithInlineCache>::GetOffsetOfHomeObj(), TyMachPtr, func);
                    Lowerer::InsertMove(instanceRegOpnd, indirInlineFuncHomeObjOpnd, instr);
                    InsertBranch(Js::OpCode::Br, testLabel, instr);
                }
            }
        }

        instr->InsertBefore(scriptFuncLabel);

        // All other cases
        {
            IR::IndirOpnd* indirOpnd = IR::IndirOpnd::New(instanceRegOpnd, Js::ScriptFunctionWithHomeObj::GetOffsetOfHomeObj(), TyMachPtr, func);
            Lowerer::InsertMove(instanceRegOpnd, indirOpnd, instr);
        }
    }
    else
    {
        // Even if the function does not have home object in eval cases we still have the LdHomeObj opcode
        InsertBranch(Js::OpCode::Br, labelDone, instr);
    }

    instr->InsertBefore(testLabel);
    InsertTestBranch(instanceRegOpnd, instanceRegOpnd, Js::OpCode::BrEq_A, labelDone, instr);

    Lowerer::InsertMove(dstOpnd, instanceRegOpnd, instr);

    instr->InsertBefore(labelDone);
    instr->Remove();
}